

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketInitiator.cpp
# Opt level: O3

void __thiscall
FIX::SocketInitiator::SocketInitiator
          (SocketInitiator *this,Application *application,MessageStoreFactory *factory,
          SessionSettings *settings)

{
  _Rb_tree_header *p_Var1;
  
  Initiator::Initiator(&this->super_Initiator,application,factory,settings);
  (this->super_Initiator)._vptr_Initiator = (_func_int **)&PTR__SocketInitiator_001f7560;
  (this->super_Strategy)._vptr_Strategy = (_func_int **)&DAT_001f75e0;
  p_Var1 = &(this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_settings).m_settings._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_settings).m_defaults._vptr_Dictionary = (_func_int **)&PTR__Dictionary_001f5658;
  p_Var1 = &(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header;
  (this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  *(_Base_ptr *)
   ((long)&(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header + 0x10)
       = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_header + 0x18)
       = p_Var1;
  (this->m_settings).m_defaults.m_data._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_settings).m_defaults.m_name._M_dataplus._M_p =
       (pointer)&(this->m_settings).m_defaults.m_name.field_2;
  (this->m_settings).m_defaults.m_name._M_string_length = 0;
  (this->m_settings).m_defaults.m_name.field_2._M_local_buf[0] = '\0';
  (this->m_settings).m_resolveEnvVars = false;
  *(undefined8 *)&(this->m_hostDetailsProvider).getTime.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_hostDetailsProvider).getTime.super__Function_base._M_functor + 8)
       = 0;
  (this->m_hostDetailsProvider).getTime._M_invoker =
       std::
       _Function_handler<long_(),_FIX::HostDetailsProvider::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/HostDetailsProvider.h:27:37)>
       ::_M_invoke;
  (this->m_hostDetailsProvider).getTime.super__Function_base._M_manager =
       std::
       _Function_handler<long_(),_FIX::HostDetailsProvider::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/HostDetailsProvider.h:27:37)>
       ::_M_manager;
  p_Var1 = &(this->m_hostDetailsProvider).m_sessionToLastConnectionAttempt._M_t._M_impl.
            super__Rb_tree_header;
  (this->m_hostDetailsProvider).m_sessionToLastConnectionAttempt._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  (this->m_hostDetailsProvider).m_sessionToLastConnectionAttempt._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_parent = (_Base_ptr)0x0;
  (this->m_hostDetailsProvider).m_sessionToLastConnectionAttempt._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_left = &p_Var1->_M_header;
  (this->m_hostDetailsProvider).m_sessionToLastConnectionAttempt._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_right = &p_Var1->_M_header;
  (this->m_hostDetailsProvider).m_sessionToLastConnectionAttempt._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  SocketConnector::SocketConnector(&this->m_connector,1);
  p_Var1 = &(this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->m_pendingConnections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_lastConnect = 0;
  this->m_reconnectInterval = 0x1e;
  this->m_noDelay = false;
  this->m_sendBufSize = 0;
  this->m_rcvBufSize = 0;
  return;
}

Assistant:

EXCEPT(ConfigError)
    : Initiator(application, factory, settings),
      m_connector(1),
      m_lastConnect(0),
      m_reconnectInterval(30),
      m_noDelay(false),
      m_sendBufSize(0),
      m_rcvBufSize(0) {}